

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

String * kj::encodeUriPath(String *__return_storage_ptr__,ArrayPtr<const_unsigned_char> bytes)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [12];
  unkbyte10 Var3;
  String *pSVar4;
  uint uVar5;
  ulong in_RCX;
  size_t sVar6;
  size_t sVar7;
  byte bVar8;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  undefined1 auVar9 [16];
  char cVar13;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  byte b;
  Vector<char> result;
  byte local_72 [2];
  String *local_70;
  ArrayBuilder<char> local_68;
  undefined1 local_48 [16];
  ArrayDisposer *local_38;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar15 [16];
  undefined2 uVar23;
  
  sVar6 = bytes.size_;
  local_70 = __return_storage_ptr__;
  local_68.ptr = _::HeapArrayDisposer::allocateUninitialized<char>(sVar6 + 1);
  local_68.endPtr = local_68.ptr + sVar6 + 1;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_68.pos = local_68.ptr;
  for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
    local_72[0] = bytes.ptr[sVar7];
    auVar9 = pshuflw(ZEXT216(CONCAT11(local_72[0],local_72[0])),
                     ZEXT216(CONCAT11(local_72[0],local_72[0])),0);
    bVar8 = auVar9[0] - 0x40;
    bVar10 = auVar9[1] + 0x9f;
    bVar11 = auVar9[2] - 0x30;
    bVar12 = auVar9[3] - 0x26;
    cVar13 = -((byte)((bVar8 < 0x1c) * '\x1c' | (bVar8 >= 0x1c) * bVar8) == bVar8);
    cVar20 = -((byte)((bVar10 < 0x1a) * '\x1a' | (bVar10 >= 0x1a) * bVar10) == bVar10);
    cVar21 = -((byte)((bVar11 < 0xc) * '\f' | (bVar11 >= 0xc) * bVar11) == bVar11);
    cVar22 = -((byte)((bVar12 < 9) * '\t' | (bVar12 >= 9) * bVar12) == bVar12);
    auVar14._0_13_ = ZEXT613(0xffffffffffff) << 0x38;
    auVar15[0xd] = 0xff;
    auVar15._0_13_ = auVar14._0_13_;
    auVar15[0xe] = 0xff;
    auVar15[0xf] = 0xff;
    auVar14._14_2_ = auVar15._14_2_;
    auVar14[0xd] = 0xff;
    Var3 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45((int)(
                                                  CONCAT36(auVar14._13_3_,0xffffffffffff) >> 0x28),
                                                  0xffffffffff) >> 0x20),0xffffffff) >> 0x18),
                                                  0xffffff) >> 0x10),0xffff) >> 8),cVar22),cVar22);
    auVar2._2_10_ = Var3;
    auVar2[1] = cVar21;
    auVar2[0] = cVar21;
    auVar1._2_12_ = auVar2;
    auVar1[1] = cVar20;
    auVar1[0] = cVar20;
    auVar9._0_2_ = CONCAT11(cVar13,cVar13);
    auVar9._2_14_ = auVar1;
    uVar23 = (undefined2)Var3;
    auVar19._0_12_ = auVar9._0_12_;
    auVar19._12_2_ = uVar23;
    auVar19._14_2_ = uVar23;
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._0_10_ = auVar9._0_10_;
    auVar18._10_2_ = auVar2._0_2_;
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._0_8_ = auVar9._0_8_;
    auVar17._8_2_ = auVar2._0_2_;
    auVar16._8_8_ = auVar17._8_8_;
    auVar16._6_2_ = auVar1._0_2_;
    auVar16._4_2_ = auVar1._0_2_;
    auVar16._2_2_ = auVar9._0_2_;
    auVar16._0_2_ = auVar9._0_2_;
    uVar5 = movmskps((int)in_RCX,auVar16);
    in_RCX = (ulong)(uVar5 ^ 0xf);
    if ((((uVar5 ^ 0xf) == 0) &&
        (((in_RCX = (ulong)(local_72[0] - 0x21), 0x3e < local_72[0] - 0x21 ||
          ((0x7000000010000009U >> (in_RCX & 0x3f) & 1) == 0)) && (local_72[0] != 0x7e)))) &&
       (local_72[0] != 0x7c)) {
      local_72[1] = 0x25;
      Vector<char>::add<char>((Vector<char> *)&local_68,(char *)(local_72 + 1));
      Vector<char>::add<char_const&>
                ((Vector<char> *)&local_68,"0123456789ABCDEF" + (local_72[0] >> 4));
      Vector<char>::add<char_const&>
                ((Vector<char> *)&local_68,"0123456789ABCDEF" + (local_72[0] & 0xf));
    }
    else {
      Vector<char>::add<unsigned_char&>((Vector<char> *)&local_68,local_72);
    }
  }
  local_72[0] = 0;
  Vector<char>::add<char>((Vector<char> *)&local_68,(char *)local_72);
  Vector<char>::releaseAsArray((Array<char> *)local_48,(Vector<char> *)&local_68);
  pSVar4 = local_70;
  (local_70->content).ptr = (char *)local_48._0_8_;
  (local_70->content).size_ = local_48._8_8_;
  (local_70->content).disposer = local_38;
  local_48 = (undefined1  [16])0x0;
  Array<char>::~Array((Array<char> *)local_48);
  ArrayBuilder<char>::dispose(&local_68);
  return pSVar4;
}

Assistant:

String encodeUriPath(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('@' <= b && b <= '[') || // covers A-Z
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= ';') || // covers 0-9
        ('&' <= b && b <= '.') ||
        b == '_' || b == '!' || b == '=' || b == ']' ||
        b == '^' || b == '|' || b == '~' || b == '$') {
      result.add(b);
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}